

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
Jam_Turn(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int dep,GameBoard *gameBoard,
        int pl_col,vector<double,_std::allocator<double>_> *A_i)

{
  int *piVar1;
  int iVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  int iVar4;
  long lVar5;
  int *in_stack_ffffffffffffffb0;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 100000;
  lVar5 = 0;
  do {
    iVar2 = gameBoard->typeCountForColor[pl_col][lVar5];
    if (iVar4 < iVar2) {
      iVar2 = iVar4;
    }
    iVar4 = iVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  local_44 = 0;
  local_40 = dep + 1;
  local_3c = pl_col;
  do {
    iVar2 = gameBoard->typeCountForColor[pl_col][local_44];
    if (iVar2 <= iVar4 + 1) {
      gameBoard->typeCountForColor[pl_col][local_44] = iVar2 + 1;
      local_38 = Place_Turn(local_40,gameBoard,local_3c,local_44,&nouse,&nouse,&nouse,
                            in_stack_ffffffffffffffb0);
      __position._M_current =
           (A_i->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (A_i->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (A_i,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (A_i->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position_00,&local_44
                  );
      }
      else {
        *__position_00._M_current = local_44;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      piVar1 = gameBoard->typeCountForColor[pl_col] + local_44;
      *piVar1 = *piVar1 + -1;
    }
    bVar3 = local_44 < 6;
    local_44 = local_44 + 1;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

vector<int> Jam_Turn(int dep, GameBoard &gameBoard, int pl_col, vector<double> &A_i) //返回可行方案编号
{
    int  min_type = 1e5;
    vector<int> index;
    for (int i = 0; i < 7; i++)
        min_type = std::min(gameBoard.typeCountForColor[pl_col][i], min_type);
    for (int i = 0; i < 7; i++)
        if (gameBoard.typeCountForColor[pl_col][i] <= min_type + 1)
        {
            gameBoard.typeCountForColor[pl_col][i] ++;
            A_i.push_back(Place_Turn(dep + 1, gameBoard, pl_col, i));
            index.push_back(i);
            gameBoard.typeCountForColor[pl_col][i] --;
        }
    return index;
}